

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddCol(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *objValue,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *lowerValue,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *colVec,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *upperValue,bool scale)

{
  Item *pIVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  pointer pnVar5;
  pointer pnVar6;
  Item *pIVar7;
  type_conflict5 tVar8;
  double *pdVar9;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar10;
  int iVar11;
  ulong uVar12;
  uint local_238;
  int idx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  int local_1c0;
  undefined1 local_1bc;
  undefined8 local_1b8;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  empty;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  int local_80;
  undefined1 local_7c;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  iVar3 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar4 = (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  empty.left.m_backend.data._M_elems[0] = 0;
  idx = iVar3;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add(&this->
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ,objValue,lowerValue,colVec,upperValue,(int *)&empty);
  if (this->thesense != MAXIMIZE) {
    boost::multiprecision::backends::eval_multiply<50u,int,void>
              (&(this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).object.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend,-1);
  }
  if (scale) {
    local_238 = (*this->lp_scaler->_vptr_SPxScaler[1])
                          (this->lp_scaler,colVec,
                           &(this->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).scaleExp);
    pnVar5 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar9 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)&empty,*pdVar9,(type *)0x0);
    tVar8 = boost::multiprecision::operator<(pnVar5 + iVar3,&empty.left);
    if (tVar8) {
      pnVar5 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_48 = *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 8);
      local_68 = *(undefined8 *)&pnVar5[iVar3].m_backend.data;
      uStack_60 = *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2);
      puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
      local_58 = *(undefined8 *)puVar2;
      uStack_50 = *(undefined8 *)(puVar2 + 2);
      local_40 = pnVar5[iVar3].m_backend.exp;
      local_3c = pnVar5[iVar3].m_backend.neg;
      local_38._0_4_ = pnVar5[iVar3].m_backend.fpclass;
      local_38._4_4_ = pnVar5[iVar3].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&empty,(soplex *)&local_68,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)-local_238,CONCAT31((int3)((uint)local_40 >> 8),local_3c));
      pnVar6 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)(pnVar6[iVar3].m_backend.data._M_elems + 8) =
           empty.left.m_backend.data._M_elems._32_8_;
      puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = empty.left.m_backend.data._M_elems._16_8_;
      *(undefined8 *)(puVar2 + 2) = empty.left.m_backend.data._M_elems._24_8_;
      pnVar5 = pnVar6 + iVar3;
      (pnVar5->m_backend).data._M_elems[0] = empty.left.m_backend.data._M_elems[0];
      (pnVar5->m_backend).data._M_elems[1] = empty.left.m_backend.data._M_elems[1];
      (pnVar5->m_backend).data._M_elems[2] = empty.left.m_backend.data._M_elems[2];
      (pnVar5->m_backend).data._M_elems[3] = empty.left.m_backend.data._M_elems[3];
      pnVar6[iVar3].m_backend.exp = empty.left.m_backend.exp;
      pnVar6[iVar3].m_backend.neg = empty.left.m_backend.neg;
      pnVar6[iVar3].m_backend.fpclass = empty.left.m_backend.fpclass;
      pnVar6[iVar3].m_backend.prec_elem = empty.left.m_backend.prec_elem;
    }
    pnVar5 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).low.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar9 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)&empty,-*pdVar9,(type *)0x0);
    tVar8 = boost::multiprecision::operator>(pnVar5 + iVar3,&empty.left);
    if (tVar8) {
      pnVar5 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_88 = *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 8);
      local_a8 = *(undefined8 *)&pnVar5[iVar3].m_backend.data;
      uStack_a0 = *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2);
      puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
      local_98 = *(undefined8 *)puVar2;
      uStack_90 = *(undefined8 *)(puVar2 + 2);
      local_80 = pnVar5[iVar3].m_backend.exp;
      local_7c = pnVar5[iVar3].m_backend.neg;
      local_78._0_4_ = pnVar5[iVar3].m_backend.fpclass;
      local_78._4_4_ = pnVar5[iVar3].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&empty,(soplex *)&local_a8,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)-local_238,CONCAT31((int3)((uint)local_80 >> 8),local_7c));
      pnVar5 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 8) =
           empty.left.m_backend.data._M_elems._32_8_;
      puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = empty.left.m_backend.data._M_elems._16_8_;
      *(undefined8 *)(puVar2 + 2) = empty.left.m_backend.data._M_elems._24_8_;
      *(ulong *)&pnVar5[iVar3].m_backend.data =
           CONCAT44(empty.left.m_backend.data._M_elems[1],empty.left.m_backend.data._M_elems[0]);
      *(ulong *)(pnVar5[iVar3].m_backend.data._M_elems + 2) =
           CONCAT44(empty.left.m_backend.data._M_elems[3],empty.left.m_backend.data._M_elems[2]);
      pnVar5[iVar3].m_backend.exp = empty.left.m_backend.exp;
      pnVar5[iVar3].m_backend.neg = empty.left.m_backend.neg;
      pnVar5[iVar3].m_backend.fpclass = empty.left.m_backend.fpclass;
      pnVar5[iVar3].m_backend.prec_elem = empty.left.m_backend.prec_elem;
    }
    pnVar5 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_c8 = *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 8);
    local_e8 = *(undefined8 *)&pnVar5[iVar3].m_backend.data;
    uStack_e0 = *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
    local_d8 = *(undefined8 *)puVar2;
    uStack_d0 = *(undefined8 *)(puVar2 + 2);
    local_c0 = pnVar5[iVar3].m_backend.exp;
    local_bc = pnVar5[iVar3].m_backend.neg;
    local_b8._0_4_ = pnVar5[iVar3].m_backend.fpclass;
    local_b8._4_4_ = pnVar5[iVar3].m_backend.prec_elem;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)&empty,(soplex *)&local_e8,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)local_238,CONCAT31((int3)((uint)local_c0 >> 8),local_bc));
    pnVar5 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 8) =
         empty.left.m_backend.data._M_elems._32_8_;
    puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = empty.left.m_backend.data._M_elems._16_8_;
    *(undefined8 *)(puVar2 + 2) = empty.left.m_backend.data._M_elems._24_8_;
    *(ulong *)&pnVar5[iVar3].m_backend.data =
         CONCAT44(empty.left.m_backend.data._M_elems[1],empty.left.m_backend.data._M_elems[0]);
    *(ulong *)(pnVar5[iVar3].m_backend.data._M_elems + 2) =
         CONCAT44(empty.left.m_backend.data._M_elems[3],empty.left.m_backend.data._M_elems[2]);
    pnVar5[iVar3].m_backend.exp = empty.left.m_backend.exp;
    pnVar5[iVar3].m_backend.neg = empty.left.m_backend.neg;
    pnVar5[iVar3].m_backend.fpclass = empty.left.m_backend.fpclass;
    pnVar5[iVar3].m_backend.prec_elem = empty.left.m_backend.prec_elem;
    (this->
    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).scaleExp.data[iVar3] = local_238;
  }
  else {
    local_238 = 0;
  }
  pIVar7 = (this->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem;
  iVar3 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[iVar3].idx;
  pIVar1 = pIVar7 + iVar3;
  uVar12 = (ulong)(uint)pIVar7[iVar3].data.
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused;
  while (0 < (int)uVar12) {
    uVar12 = uVar12 - 1;
    pNVar10 = (pIVar1->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    iVar3 = pNVar10[uVar12].idx;
    if (scale) {
      local_1e8 = *(undefined8 *)&pNVar10[uVar12].val.m_backend.data;
      uStack_1e0 = *(undefined8 *)(pNVar10[uVar12].val.m_backend.data._M_elems + 2);
      puVar2 = pNVar10[uVar12].val.m_backend.data._M_elems + 4;
      local_1d8 = *(undefined8 *)puVar2;
      uStack_1d0 = *(undefined8 *)(puVar2 + 2);
      local_1c8 = *(undefined8 *)(pNVar10[uVar12].val.m_backend.data._M_elems + 8);
      local_1c0 = pNVar10[uVar12].val.m_backend.exp;
      local_1bc = pNVar10[uVar12].val.m_backend.neg;
      local_1b8._0_4_ = pNVar10[uVar12].val.m_backend.fpclass;
      local_1b8._4_4_ = pNVar10[uVar12].val.m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&empty,(soplex *)&local_1e8,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)((this->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).scaleExp.data[iVar3] + local_238),
                 CONCAT31((int3)((uint)local_1c0 >> 8),local_1bc));
      pNVar10 = (pIVar1->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      *(undefined8 *)(pNVar10[uVar12].val.m_backend.data._M_elems + 8) =
           empty.left.m_backend.data._M_elems._32_8_;
      puVar2 = pNVar10[uVar12].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = empty.left.m_backend.data._M_elems._16_8_;
      *(undefined8 *)(puVar2 + 2) = empty.left.m_backend.data._M_elems._24_8_;
      *(ulong *)&pNVar10[uVar12].val.m_backend.data =
           CONCAT44(empty.left.m_backend.data._M_elems[1],empty.left.m_backend.data._M_elems[0]);
      *(ulong *)(pNVar10[uVar12].val.m_backend.data._M_elems + 2) =
           CONCAT44(empty.left.m_backend.data._M_elems[3],empty.left.m_backend.data._M_elems[2]);
      pNVar10[uVar12].val.m_backend.exp = empty.left.m_backend.exp;
      pNVar10[uVar12].val.m_backend.neg = empty.left.m_backend.neg;
      pNVar10[uVar12].val.m_backend.fpclass = empty.left.m_backend.fpclass;
      pNVar10[uVar12].val.m_backend.prec_elem = empty.left.m_backend.prec_elem;
      pNVar10 = (pIVar1->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
    }
    local_228.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pNVar10[uVar12].val.m_backend.data._M_elems + 8);
    local_228.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pNVar10[uVar12].val.m_backend.data;
    local_228.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pNVar10[uVar12].val.m_backend.data._M_elems + 2);
    puVar2 = pNVar10[uVar12].val.m_backend.data._M_elems + 4;
    local_228.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_228.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    local_228.m_backend.exp = pNVar10[uVar12].val.m_backend.exp;
    local_228.m_backend.neg = pNVar10[uVar12].val.m_backend.neg;
    local_228.m_backend.fpclass = pNVar10[uVar12].val.m_backend.fpclass;
    local_228.m_backend.prec_elem = pNVar10[uVar12].val.m_backend.prec_elem;
    if ((this->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum <= iVar3) {
      LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::LPRowBase(&empty,0);
      for (iVar11 = (this->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum; iVar11 <= iVar3; iVar11 = iVar11 + 1) {
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&empty);
      }
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~DSVectorBase(&empty.vec);
    }
    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add2(&this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ,iVar3,1,&idx,&local_228);
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x51])(this,1);
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum - iVar4));
  return;
}

Assistant:

void doAddCol(const R& objValue, const R& lowerValue, const SVectorBase<R>& colVec,
                 const R& upperValue, bool scale = false)
   {
      int idx = nCols();
      int oldRowNumber = nRows();
      int newColScaleExp = 0;

      LPColSetBase<R>::add(objValue, lowerValue, colVec, upperValue);

      if(thesense != MAXIMIZE)
         LPColSetBase<R>::maxObj_w(idx) *= -1;

      DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

      // compute new column scaling factor and apply it to the bounds
      if(scale)
      {
         newColScaleExp = lp_scaler->computeScaleExp(colVec, rowscaleExp);

         if(upper(idx) < R(infinity))
            upper_w(idx) = spxLdexp(upper_w(idx), - newColScaleExp);

         if(lower(idx) > R(-infinity))
            lower_w(idx) = spxLdexp(lower_w(idx), - newColScaleExp);

         maxObj_w(idx) = spxLdexp(maxObj_w(idx), newColScaleExp);

         LPColSetBase<R>::scaleExp[idx] = newColScaleExp;
      }

      SVectorBase<R>& vec = colVector_w(idx);

      // now insert nonzeros to row file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[i]);

         R val = vec.value(j);

         // create new rows if required
         if(i >= nRows())
         {
            LPRowBase<R> empty;

            for(int k = nRows(); k <= i; ++k)
               LPRowSetBase<R>::add(empty);
         }

         assert(i < nRows());
         LPRowSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedCols(1);
      addedRows(nRows() - oldRowNumber);
   }